

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CNode::SetAddrLocal(CNode *this,CService *addrLocalIn)

{
  long lVar1;
  CService *this_00;
  CNetAddr *this_01;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock32;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CService *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int line;
  char *val;
  char *pszFile;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (CNetAddr *)(in_RDI + 0x318);
  val = "m_addr_local_mutex";
  pszFile = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (Mutex *)0x206788);
  line = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,pszFile,
             (int)((ulong)val >> 0x20),SUB81((ulong)val >> 0x18,0));
  CNetAddr::IsValid(this_01);
  this_00 = (CService *)
            inline_assertion_check<false,bool>
                      ((bool *)val,(char *)this_01,line,(char *)in_stack_ffffffffffffff90,
                       (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (((this_00->super_CNetAddr).m_addr._union.direct[0] & 1U) != 0) {
    CService::operator=(this_00,in_stack_ffffffffffffff90);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::SetAddrLocal(const CService& addrLocalIn) {
    AssertLockNotHeld(m_addr_local_mutex);
    LOCK(m_addr_local_mutex);
    if (Assume(!m_addr_local.IsValid())) { // Addr local can only be set once during version msg processing
        m_addr_local = addrLocalIn;
    }
}